

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Person.cpp
# Opt level: O0

Person * __thiscall Person::operator=(Person *this,Person *person)

{
  Person *person_local;
  Person *this_local;
  
  std::__cxx11::string::operator=((string *)&this->id,(string *)&person->id);
  std::__cxx11::string::operator=((string *)&this->name,(string *)&person->name);
  Address::operator=(&this->address,&person->address);
  return this;
}

Assistant:

Person &Person::operator=(const Person &person) {
    id = person.id;
    name = person.name;
    address = person.address;
    return *this;
}